

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  Scl_Item_t *pSVar6;
  Scl_Item_t *pSVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = Scl_LibertyItemNum(p,p->pItems,"wire_load_selection");
  Vec_StrPutI_(vOut,iVar2);
  pSVar7 = p->pItems;
  uVar1 = pSVar7->Child;
  if ((int)uVar1 < p->nItems) {
    if (pSVar7 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
      pSVar7 = pSVar7 + uVar1;
      do {
        iVar2 = (pSVar7->Key).Beg;
        iVar3 = (pSVar7->Key).End - iVar2;
        iVar2 = strncmp(p->pContents + iVar2,"wire_load_selection",(long)iVar3);
        if (iVar3 == 0x13 && iVar2 == 0) {
          pcVar4 = Scl_LibertyReadString(p,pSVar7->Head);
          Vec_StrPutS_(vOut,pcVar4);
          iVar2 = Scl_LibertyItemNum(p,pSVar7,"wire_load_from_area");
          Vec_StrPutI_(vOut,iVar2);
          uVar1 = pSVar7->Child;
          while( true ) {
            if (p->nItems <= (int)uVar1) goto LAB_003e6433;
            if ((int)uVar1 < 0) {
              pSVar6 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar6 = p->pItems + uVar1;
            }
            if (pSVar6 == (Scl_Item_t *)0x0) break;
            iVar2 = (pSVar6->Key).Beg;
            iVar3 = (pSVar6->Key).End - iVar2;
            iVar2 = strncmp(p->pContents + iVar2,"wire_load_from_area",(long)iVar3);
            if (iVar3 == 0x13 && iVar2 == 0) {
              pcVar4 = Scl_LibertyReadString(p,pSVar6->Head);
              pcVar4 = strtok(pcVar4," ,");
              dVar8 = atof(pcVar4);
              pcVar4 = strtok((char *)0x0," ,");
              dVar9 = atof(pcVar4);
              pcVar4 = strtok((char *)0x0," ");
              if (*pcVar4 == '\"') {
                sVar5 = strlen(pcVar4);
                if (pcVar4[sVar5 - 1] != '\"') {
                  __assert_fail("pThird[strlen(pThird)-1] == \'\\\"\'",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,900,"void Scl_LibertyReadWireLoadSelect(Scl_Tree_t *, Vec_Str_t *)"
                               );
                }
                pcVar4[sVar5 - 1] = '\0';
                pcVar4 = pcVar4 + 1;
              }
              Vec_StrPutF_(vOut,(float)dVar8);
              Vec_StrPutF_(vOut,(float)dVar9);
              Vec_StrPutS_(vOut,pcVar4);
            }
            uVar1 = pSVar6->Next;
          }
        }
        uVar1 = pSVar7->Next;
        if (p->nItems <= (int)uVar1) goto LAB_003e6433;
        if ((int)uVar1 < 0) {
          pSVar7 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar7 = p->pItems + uVar1;
        }
      } while (pSVar7 != (Scl_Item_t *)0x0);
    }
    return;
  }
LAB_003e6433:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

void Scl_LibertyReadWireLoadSelect( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load_selection") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load_selection" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "wire_load_from_area") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "wire_load_from_area" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            float  First  = atof( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ,") );
            char * pThird = strtok(NULL, " ");
            if ( pThird[0] == '\"' )
                assert(pThird[strlen(pThird)-1] == '\"'), pThird[strlen(pThird)-1] = 0, pThird++;
            Vec_StrPutF_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPutS_( vOut, pThird );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}